

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O0

int cipher_set_ctx_params(void *vgctx,OSSL_PARAM *params)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  size_t taglen;
  void *val;
  char tag [1024];
  size_t ivlen;
  size_t key_mesh;
  uint pad;
  int ret;
  size_t derlen;
  uchar *der;
  ASN1_TYPE *algidparam;
  OSSL_PARAM *p;
  GOST_CTX *gctx;
  bool local_469;
  undefined8 local_468;
  undefined1 *local_460;
  undefined1 local_458 [1024];
  undefined8 local_58;
  undefined8 local_50;
  int local_48;
  uint local_44;
  long local_40;
  uchar *local_38;
  ASN1_TYPE *local_30;
  long local_28;
  long local_20;
  undefined8 local_18;
  uint local_4;
  
  local_20 = in_RDI;
  local_18 = in_RSI;
  local_28 = OSSL_PARAM_locate_const(in_RSI,"alg_id_param");
  if (local_28 == 0) {
    local_28 = OSSL_PARAM_locate_const(local_18,"padding");
    if (local_28 != 0) {
      local_48 = 0;
      iVar1 = OSSL_PARAM_get_uint(local_28,&local_48);
      if ((iVar1 == 0) ||
         (iVar1 = EVP_CIPHER_CTX_set_padding(*(EVP_CIPHER_CTX **)(local_20 + 0x20),local_48),
         iVar1 < 1)) {
        return 0;
      }
    }
    local_28 = OSSL_PARAM_locate_const(local_18,"key-mesh");
    if (local_28 != 0) {
      local_50 = 0;
      iVar1 = OSSL_PARAM_get_size_t(local_28,&local_50);
      if ((iVar1 == 0) ||
         (iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(local_20 + 0x20),0x20,(int)local_50,
                                      (void *)0x0), iVar1 < 1)) {
        return 0;
      }
    }
    local_28 = OSSL_PARAM_locate_const(local_18,"ivlen");
    if (local_28 != 0) {
      local_58 = 0;
      iVar1 = OSSL_PARAM_get_size_t(local_28,&local_58);
      if ((iVar1 == 0) ||
         (iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(local_20 + 0x20),9,(int)local_58,
                                      (void *)0x0), iVar1 < 1)) {
        return 0;
      }
    }
    local_28 = OSSL_PARAM_locate_const(local_18,"tag");
    if (local_28 != 0) {
      local_460 = local_458;
      local_468 = 0;
      iVar1 = OSSL_PARAM_get_octet_string(local_28,&local_460,0x400,&local_468);
      if ((iVar1 == 0) ||
         (iVar1 = EVP_CIPHER_CTX_ctrl(*(EVP_CIPHER_CTX **)(local_20 + 0x20),0x11,(int)local_468,
                                      local_458), iVar1 < 1)) {
        return 0;
      }
    }
    local_4 = 1;
  }
  else {
    local_30 = (ASN1_TYPE *)0x0;
    local_38 = (uchar *)0x0;
    local_40 = 0;
    iVar1 = OSSL_PARAM_get_octet_string_ptr(local_28,&local_38,&local_40);
    local_469 = false;
    if (iVar1 != 0) {
      local_30 = d2i_ASN1_TYPE((ASN1_TYPE **)0x0,&local_38,local_40);
      local_469 = false;
      if (local_30 != (ASN1_TYPE *)0x0) {
        iVar1 = EVP_CIPHER_asn1_to_param(*(EVP_CIPHER_CTX **)(local_20 + 0x20),local_30);
        local_469 = 0 < iVar1;
      }
    }
    local_44 = (uint)local_469;
    ASN1_TYPE_free(local_30);
    local_4 = local_44;
  }
  return local_4;
}

Assistant:

static int cipher_set_ctx_params(void *vgctx, const OSSL_PARAM params[])
{
    GOST_CTX *gctx = vgctx;
    const OSSL_PARAM *p;

    if ((p = OSSL_PARAM_locate_const(params, "alg_id_param")) != NULL) {
        ASN1_TYPE *algidparam = NULL;
        const unsigned char *der = NULL;
        size_t derlen = 0;
        int ret;

        ret = OSSL_PARAM_get_octet_string_ptr(p, (const void **)&der, &derlen)
            && (algidparam = d2i_ASN1_TYPE(NULL, &der, (long)derlen)) != NULL
            && EVP_CIPHER_asn1_to_param(gctx->cctx, algidparam) > 0;

        ASN1_TYPE_free(algidparam);
        return ret;
    }
    if ((p = OSSL_PARAM_locate_const(params, "padding")) != NULL) {
        unsigned int pad = 0;

        if (!OSSL_PARAM_get_uint(p, &pad)
            || EVP_CIPHER_CTX_set_padding(gctx->cctx, pad) <= 0)
            return 0;
    }
    if ((p = OSSL_PARAM_locate_const(params, "key-mesh")) != NULL) {
        size_t key_mesh = 0;

        if (!OSSL_PARAM_get_size_t(p, &key_mesh)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_KEY_MESH,
                                   key_mesh, NULL) <= 0)
            return 0;
    }
    if ((p = OSSL_PARAM_locate_const(params, OSSL_CIPHER_PARAM_IVLEN)) != NULL) {
        size_t ivlen = 0;

        if (!OSSL_PARAM_get_size_t(p, &ivlen)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_AEAD_SET_IVLEN,
                                   ivlen, NULL) <= 0)
            return 0;
    }
    if ((p = OSSL_PARAM_locate_const(params, OSSL_CIPHER_PARAM_AEAD_TAG)) != NULL) {
        char tag[1024];
        void *val = (void *) tag;
        size_t taglen = 0;

        if (!OSSL_PARAM_get_octet_string(p, &val, 1024, &taglen)
            || EVP_CIPHER_CTX_ctrl(gctx->cctx, EVP_CTRL_AEAD_SET_TAG,
                                   taglen, &tag) <= 0)
            return 0;
    }
    return 1;
}